

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexTriangleFilter::applyAcrossEdge
          (PtexTriangleFilter *this,PtexTriangleKernel *k,FaceInfo *f,int eid)

{
  int iVar1;
  EdgeId eid_00;
  int in_ECX;
  FaceInfo *in_RDX;
  long in_RDI;
  FaceInfo *af;
  int aeid;
  int afid;
  FaceInfo *in_stack_00000058;
  int in_stack_00000064;
  PtexTriangleKernel *in_stack_00000068;
  PtexTriangleFilter *in_stack_00000070;
  int in_stack_ffffffffffffffd8;
  
  iVar1 = FaceInfo::adjface(in_RDX,in_ECX);
  eid_00 = FaceInfo::adjedge(in_RDX,in_ECX);
  (**(code **)(**(long **)(in_RDI + 8) + 0x80))(*(long **)(in_RDI + 8),iVar1);
  PtexTriangleKernel::reorient
            ((PtexTriangleKernel *)CONCAT44(in_ECX,iVar1),eid_00,in_stack_ffffffffffffffd8);
  splitAndApply(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000058);
  return;
}

Assistant:

void PtexTriangleFilter::applyAcrossEdge(PtexTriangleKernel& k,
                                         const Ptex::FaceInfo& f, int eid)
{
    int afid = f.adjface(eid), aeid = f.adjedge(eid);
    const Ptex::FaceInfo& af = _tx->getFaceInfo(afid);
    k.reorient(eid, aeid);
    splitAndApply(k, afid, af);
}